

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool Grammar::is_keyword_message_part(string *str)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  byte unaff_BPL;
  int iVar4;
  ulong uVar5;
  string local_90;
  string local_70;
  string local_50;
  
  uVar5 = 0;
  iVar4 = (int)str->_M_string_length;
  uVar3 = 0;
  if (0 < iVar4) {
    uVar3 = str->_M_string_length & 0xffffffff;
  }
  do {
    if (uVar3 == uVar5) {
LAB_0014f2d2:
      return (bool)((long)uVar5 < (long)iVar4 & unaff_BPL);
    }
    cVar1 = (str->_M_dataplus)._M_p[uVar5];
    if ((cVar1 == '?') || (cVar1 == ':')) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
      bVar2 = is_keyword_message_token(&local_50);
      if (bVar2) {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)str);
        str_utils::ltrim(&local_70,&local_90);
        unaff_BPL = is_keyword_message_argument(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        unaff_BPL = false;
      }
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_0014f2d2;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool Grammar::is_keyword_message_part(const std::string& str) {
    for (int i = 0; i < int(str.size()); i++)
        if (str[i] == ':' || str[i] == '?')
            return is_keyword_message_token(str.substr(0, i + 1)) &&
                   is_keyword_message_argument(str_utils::ltrim(str.substr(i + 1)));
    return false;
}